

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midi_base.cpp
# Opt level: O0

void AddDefaultMidiDevices(FOptionValues *opt)

{
  uint uVar1;
  Pair *pPVar2;
  Pair *pair;
  int p;
  FOptionValues *opt_local;
  
  uVar1 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::Reserve(&opt->mValues,6);
  pPVar2 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::operator[](&opt->mValues,(ulong)uVar1);
  FString::operator=(&pPVar2->Text,"FluidSynth");
  pPVar2->Value = -5.0;
  FString::operator=(&pPVar2[1].Text,"GUS");
  pPVar2[1].Value = -4.0;
  FString::operator=(&pPVar2[2].Text,"OPL Synth Emulation");
  pPVar2[2].Value = -3.0;
  FString::operator=(&pPVar2[3].Text,"TiMidity++");
  pPVar2[3].Value = -2.0;
  FString::operator=(&pPVar2[4].Text,"WildMidi");
  pPVar2[4].Value = -6.0;
  FString::operator=(&pPVar2[5].Text,"Sound System");
  pPVar2[5].Value = -1.0;
  return;
}

Assistant:

static void AddDefaultMidiDevices(FOptionValues *opt)
{
	int p;
	FOptionValues::Pair *pair = &opt->mValues[opt->mValues.Reserve(NUM_DEF_DEVICES)];
#ifdef HAVE_FLUIDSYNTH
	pair[0].Text = "FluidSynth";
	pair[0].Value = -5.0;
	p = 1;
#else
	p = 0;
#endif
	pair[p].Text = "GUS";
	pair[p].Value = -4.0;
	pair[p+1].Text = "OPL Synth Emulation";
	pair[p+1].Value = -3.0;
	pair[p+2].Text = "TiMidity++";
	pair[p+2].Value = -2.0;
	pair[p+3].Text = "WildMidi";
	pair[p+3].Value = -6.0;
	pair[p+4].Text = "Sound System";
	pair[p+4].Value = -1.0;

}